

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_ShaderBlock
GPU_LoadShaderBlock(Uint32 program_object,char *position_name,char *texcoord_name,char *color_name,
                   char *modelViewMatrix_name)

{
  GPU_ShaderBlock GVar1;
  char *modelViewMatrix_name_local;
  char *color_name_local;
  char *texcoord_name_local;
  char *position_name_local;
  int iStack_18;
  Uint32 program_object_local;
  GPU_ShaderBlock b;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    iStack_18 = -1;
    program_object_local = 0xffffffff;
    b.position_loc = -1;
    b.texcoord_loc = -1;
  }
  else {
    GVar1 = (*_gpu_current_renderer->impl->LoadShaderBlock)
                      (_gpu_current_renderer,program_object,position_name,texcoord_name,color_name,
                       modelViewMatrix_name);
    iStack_18 = GVar1.position_loc;
    program_object_local = GVar1.texcoord_loc;
    b.position_loc = GVar1.color_loc;
    b.texcoord_loc = GVar1.modelViewProjection_loc;
  }
  GVar1.texcoord_loc = program_object_local;
  GVar1.position_loc = iStack_18;
  GVar1.color_loc = b.position_loc;
  GVar1.modelViewProjection_loc = b.texcoord_loc;
  return GVar1;
}

Assistant:

GPU_ShaderBlock GPU_LoadShaderBlock(Uint32 program_object, const char* position_name, const char* texcoord_name, const char* color_name, const char* modelViewMatrix_name)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
    {
        GPU_ShaderBlock b;
        b.position_loc = -1;
        b.texcoord_loc = -1;
        b.color_loc = -1;
        b.modelViewProjection_loc = -1;
        return b;
    }

    return _gpu_current_renderer->impl->LoadShaderBlock(_gpu_current_renderer, program_object, position_name, texcoord_name, color_name, modelViewMatrix_name);
}